

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetB.c
# Opt level: O3

int point_mul_id_tc26_gost_3410_2012_512_paramSetB
              (EC_GROUP *group,EC_POINT *r,EC_POINT *q,BIGNUM *m,BN_CTX *ctx)

{
  uint64_t *puVar1;
  uint64_t *puVar2;
  uint64_t *out1;
  char cVar3;
  int iVar4;
  int iVar5;
  BIGNUM *pBVar6;
  BIGNUM *pBVar7;
  pt_prj_t_conflict3 *ppVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  byte arg1;
  bool bVar12;
  uchar b_y [64];
  uchar b_x [64];
  uchar b_m [64];
  pt_prj_t_conflict3 Q;
  pt_aff_t_conflict3 P;
  pt_prj_t_conflict3 lut;
  int8_t rnaf [103];
  pt_prj_t_conflict3 precomp [16];
  uint8_t local_f68 [64];
  uint8_t local_f28 [64];
  byte local_ee8 [64];
  pt_prj_t_conflict3 local_ea8;
  pt_aff_t_conflict3 local_de8;
  pt_prj_t_conflict3 local_d68;
  int8_t local_ca8 [102];
  char cStack_c42;
  pt_prj_t_conflict3 local_c38 [16];
  
  BN_CTX_start((BN_CTX *)ctx);
  pBVar6 = BN_CTX_get((BN_CTX *)ctx);
  pBVar7 = BN_CTX_get((BN_CTX *)ctx);
  iVar5 = 0;
  iVar9 = 0;
  if ((((pBVar7 != (BIGNUM *)0x0) &&
       (iVar4 = EC_POINT_get_affine_coordinates(group,q,pBVar6,pBVar7,ctx), iVar9 = iVar5,
       iVar4 != 0)) && (iVar5 = BN_bn2lebinpad(pBVar6,local_f28,0x40), iVar5 == 0x40)) &&
     ((iVar5 = BN_bn2lebinpad(pBVar7,local_f68,0x40), iVar5 == 0x40 &&
      (iVar5 = BN_bn2lebinpad(m,local_ee8,0x40), iVar5 == 0x40)))) {
    fiat_id_tc26_gost_3410_2012_512_paramSetB_from_bytes(local_de8.X,local_f28);
    puVar1 = local_de8.Y;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_from_bytes(puVar1,local_f68);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_to_montgomery(local_de8.X,local_de8.X);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_to_montgomery(puVar1,puVar1);
    local_ca8[0x50] = '\0';
    local_ca8[0x51] = '\0';
    local_ca8[0x52] = '\0';
    local_ca8[0x53] = '\0';
    local_ca8[0x54] = '\0';
    local_ca8[0x55] = '\0';
    local_ca8[0x56] = '\0';
    local_ca8[0x57] = '\0';
    local_ca8[0x58] = '\0';
    local_ca8[0x59] = '\0';
    local_ca8[0x5a] = '\0';
    local_ca8[0x5b] = '\0';
    local_ca8[0x5c] = '\0';
    local_ca8[0x5d] = '\0';
    local_ca8[0x5e] = '\0';
    local_ca8[0x40] = '\0';
    local_ca8[0x41] = '\0';
    local_ca8[0x42] = '\0';
    local_ca8[0x43] = '\0';
    local_ca8[0x44] = '\0';
    local_ca8[0x45] = '\0';
    local_ca8[0x46] = '\0';
    local_ca8[0x47] = '\0';
    local_ca8[0x48] = '\0';
    local_ca8[0x49] = '\0';
    local_ca8[0x4a] = '\0';
    local_ca8[0x4b] = '\0';
    local_ca8[0x4c] = '\0';
    local_ca8[0x4d] = '\0';
    local_ca8[0x4e] = '\0';
    local_ca8[0x4f] = '\0';
    local_ca8[0x30] = '\0';
    local_ca8[0x31] = '\0';
    local_ca8[0x32] = '\0';
    local_ca8[0x33] = '\0';
    local_ca8[0x34] = '\0';
    local_ca8[0x35] = '\0';
    local_ca8[0x36] = '\0';
    local_ca8[0x37] = '\0';
    local_ca8[0x38] = '\0';
    local_ca8[0x39] = '\0';
    local_ca8[0x3a] = '\0';
    local_ca8[0x3b] = '\0';
    local_ca8[0x3c] = '\0';
    local_ca8[0x3d] = '\0';
    local_ca8[0x3e] = '\0';
    local_ca8[0x3f] = '\0';
    local_ca8[0x20] = '\0';
    local_ca8[0x21] = '\0';
    local_ca8[0x22] = '\0';
    local_ca8[0x23] = '\0';
    local_ca8[0x24] = '\0';
    local_ca8[0x25] = '\0';
    local_ca8[0x26] = '\0';
    local_ca8[0x27] = '\0';
    local_ca8[0x28] = '\0';
    local_ca8[0x29] = '\0';
    local_ca8[0x2a] = '\0';
    local_ca8[0x2b] = '\0';
    local_ca8[0x2c] = '\0';
    local_ca8[0x2d] = '\0';
    local_ca8[0x2e] = '\0';
    local_ca8[0x2f] = '\0';
    local_ca8[0x10] = '\0';
    local_ca8[0x11] = '\0';
    local_ca8[0x12] = '\0';
    local_ca8[0x13] = '\0';
    local_ca8[0x14] = '\0';
    local_ca8[0x15] = '\0';
    local_ca8[0x16] = '\0';
    local_ca8[0x17] = '\0';
    local_ca8[0x18] = '\0';
    local_ca8[0x19] = '\0';
    local_ca8[0x1a] = '\0';
    local_ca8[0x1b] = '\0';
    local_ca8[0x1c] = '\0';
    local_ca8[0x1d] = '\0';
    local_ca8[0x1e] = '\0';
    local_ca8[0x1f] = '\0';
    local_ca8[0] = '\0';
    local_ca8[1] = '\0';
    local_ca8[2] = '\0';
    local_ca8[3] = '\0';
    local_ca8[4] = '\0';
    local_ca8[5] = '\0';
    local_ca8[6] = '\0';
    local_ca8[7] = '\0';
    local_ca8[8] = '\0';
    local_ca8[9] = '\0';
    local_ca8[10] = '\0';
    local_ca8[0xb] = '\0';
    local_ca8[0xc] = '\0';
    local_ca8[0xd] = '\0';
    local_ca8[0xe] = '\0';
    local_ca8[0xf] = '\0';
    local_ca8[0x5f] = 0;
    local_ca8[0x60] = '\0';
    local_ca8[0x61] = '\0';
    local_ca8[0x62] = '\0';
    local_ca8[99] = '\0';
    local_ca8[100] = '\0';
    local_ca8[0x65] = '\0';
    cStack_c42 = '\0';
    lVar11 = 0;
    memset(&local_ea8,0,0xc0);
    memset(&local_d68,0,0xc0);
    ppVar8 = local_c38;
    precomp_wnaf(ppVar8,&local_de8);
    scalar_rwnaf(local_ca8,local_ee8);
    iVar9 = (int)cStack_c42;
    do {
      bVar12 = (int)(iVar9 + -1 >> 1 ^ (uint)lVar11) < 1;
      fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz(local_ea8.X,bVar12,local_ea8.X,ppVar8->X);
      fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz(local_ea8.Y,bVar12,local_ea8.Y,ppVar8->Y);
      fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz(local_ea8.Z,bVar12,local_ea8.Z,ppVar8->Z);
      lVar11 = lVar11 + 1;
      ppVar8 = ppVar8 + 1;
    } while (lVar11 != 0x10);
    puVar1 = local_d68.Y;
    lVar11 = 0x65;
    puVar2 = local_d68.Z;
    do {
      iVar9 = 5;
      do {
        point_double(&local_ea8,&local_ea8);
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
      cVar3 = local_ca8[lVar11];
      ppVar8 = local_c38;
      lVar10 = 0;
      do {
        bVar12 = (int)((int)(char)(-1 - (cVar3 >> 7)) + ((int)cVar3 >> 0x1f ^ (int)cVar3) >> 1 ^
                      (uint)lVar10) < 1;
        fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz
                  (local_d68.X,bVar12,local_d68.X,ppVar8->X);
        fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz(puVar1,bVar12,puVar1,ppVar8->Y);
        fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz(puVar2,bVar12,puVar2,ppVar8->Z);
        lVar10 = lVar10 + 1;
        ppVar8 = ppVar8 + 1;
      } while (lVar10 != 0x10);
      fiat_id_tc26_gost_3410_2012_512_paramSetB_opp(local_de8.Y,puVar1);
      fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz
                (puVar1,(byte)(cVar3 >> 7) >> 7,puVar1,local_de8.Y);
      point_add_proj(&local_ea8,&local_ea8,&local_d68);
      bVar12 = lVar11 != 0;
      lVar11 = lVar11 + -1;
    } while (bVar12);
    local_d68.X[6] = local_c38[0].X[6];
    local_d68.X[7] = local_c38[0].X[7];
    local_d68.X[4] = local_c38[0].X[4];
    local_d68.X[5] = local_c38[0].X[5];
    local_d68.X[2] = local_c38[0].X[2];
    local_d68.X[3] = local_c38[0].X[3];
    local_d68.X[0] = local_c38[0].X[0];
    local_d68.X[1] = local_c38[0].X[1];
    fiat_id_tc26_gost_3410_2012_512_paramSetB_opp(puVar1,local_c38[0].Y);
    local_d68.Z[6] = local_c38[0].Z[6];
    local_d68.Z[7] = local_c38[0].Z[7];
    local_d68.Z[4] = local_c38[0].Z[4];
    local_d68.Z[5] = local_c38[0].Z[5];
    local_d68.Z[2] = local_c38[0].Z[2];
    local_d68.Z[3] = local_c38[0].Z[3];
    local_d68.Z[0] = local_c38[0].Z[0];
    local_d68.Z[1] = local_c38[0].Z[1];
    point_add_proj(&local_d68,&local_d68,&local_ea8);
    arg1 = local_ee8[0] & 1;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz(local_ea8.X,arg1,local_d68.X,local_ea8.X);
    out1 = local_ea8.Y;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz(out1,arg1,puVar1,out1);
    puVar1 = local_ea8.Z;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz(puVar1,arg1,puVar2,puVar1);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_inv(puVar1,puVar1);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(local_de8.X,local_ea8.X,puVar1);
    puVar2 = local_de8.Y;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(puVar2,out1,puVar1);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_from_montgomery(local_de8.X,local_de8.X);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_from_montgomery(puVar2,puVar2);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_to_bytes(local_f28,local_de8.X);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_to_bytes(local_f68,puVar2);
    iVar9 = CRYPTO_memcmp("",local_f28,0x40);
    if ((iVar9 == 0) && (iVar9 = CRYPTO_memcmp("",local_f68,0x40), iVar9 == 0)) {
      iVar9 = EC_POINT_set_to_infinity((EC_GROUP *)group,(EC_POINT *)r);
      if (iVar9 == 0) {
        iVar9 = 0;
        goto LAB_00138b40;
      }
    }
    else {
      lVar11 = BN_lebin2bn(local_f28,0x40,pBVar6);
      iVar9 = 0;
      if ((lVar11 == 0) ||
         ((lVar11 = BN_lebin2bn(local_f68,0x40,pBVar7), lVar11 == 0 ||
          (iVar5 = EC_POINT_set_affine_coordinates(group,r,pBVar6,pBVar7,ctx), iVar5 == 0))))
      goto LAB_00138b40;
    }
    iVar9 = 1;
  }
LAB_00138b40:
  BN_CTX_end((BN_CTX *)ctx);
  return iVar9;
}

Assistant:

int
    point_mul_id_tc26_gost_3410_2012_512_paramSetB(const EC_GROUP *group,
                                                   EC_POINT *r,
                                                   const EC_POINT *q,
                                                   const BIGNUM *m,
                                                   BN_CTX *ctx) {
    int ret = 0;
    unsigned char b_x[64];
    unsigned char b_y[64];
    unsigned char b_m[64];
    BIGNUM *x = NULL, *y = NULL;

    BN_CTX_start(ctx);
    x = BN_CTX_get(ctx);
    if ((y = BN_CTX_get(ctx)) == NULL
        /* pull out coords as bytes */
        || !EC_POINT_get_affine_coordinates(group, q, x, y, ctx) ||
        BN_bn2lebinpad(x, b_x, 64) != 64 || BN_bn2lebinpad(y, b_y, 64) != 64 ||
        BN_bn2lebinpad(m, b_m, 64) != 64)
        goto err;
    /* do the variable scalar multiplication */
    point_mul(b_x, b_y, b_m, b_x, b_y);
    /* check for infinity */
    if (CRYPTO_memcmp(const_zb, b_x, 64) == 0 &&
        CRYPTO_memcmp(const_zb, b_y, 64) == 0) {
        if (!EC_POINT_set_to_infinity(group, r)) goto err;
    } else {
        /* otherwise, pack the bytes into the result */
        if (BN_lebin2bn(b_x, 64, x) == NULL ||
            BN_lebin2bn(b_y, 64, y) == NULL ||
            !EC_POINT_set_affine_coordinates(group, r, x, y, ctx))
            goto err;
    }
    ret = 1;
err:
    BN_CTX_end(ctx);
    return ret;
}